

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O0

void __thiscall CommandLineParser::fail(CommandLineParser *this,string *message)

{
  CommandLineParserException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *message_local;
  CommandLineParser *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  this_00 = (CommandLineParserException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_78,"while parsing option ",&this->m_option);
  std::operator+(&local_58,&local_78,",\n");
  std::operator+(&local_38,&local_58,message);
  CommandLineParserException::CommandLineParserException(this_00,&local_38);
  __cxa_throw(this_00,&CommandLineParserException::typeinfo,
              CommandLineParserException::~CommandLineParserException);
}

Assistant:

void 
CommandLineParser::fail( std::string message )
{
  throw CommandLineParserException( "while parsing option " + m_option+
            ",\n" + message );
}